

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_json_encode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  SyBlob sBlob;
  SyBlob local_30;
  
  if (nArg < 1) {
    jx9_result_bool(pCtx,0);
  }
  else {
    local_30.pAllocator = &pCtx->pVm->sAllocator;
    local_30.pBlob = (char *)0x0;
    local_30.nByte = 0;
    local_30.mByte = 0;
    local_30.nFlags = 0;
    jx9JsonSerialize(*apArg,&local_30);
    jx9_result_string(pCtx,(char *)local_30.pBlob,local_30.nByte);
    SyBlobRelease(&local_30);
  }
  return 0;
}

Assistant:

static int vm_builtin_json_encode(jx9_context *pCtx,int nArg,jx9_value **apArg)
{
	SyBlob sBlob;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Init the working buffer */
	SyBlobInit(&sBlob,&pCtx->pVm->sAllocator);
	/* Perform the encoding operation */
	jx9JsonSerialize(apArg[0],&sBlob);
	/* Return the serialized value */
	jx9_result_string(pCtx,(const char *)SyBlobData(&sBlob),(int)SyBlobLength(&sBlob));
	/* Cleanup */
	SyBlobRelease(&sBlob);
	/* All done */
	return JX9_OK;
}